

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

bool BinaryenGetMemorySegmentPassive(BinaryenModuleRef module,BinaryenIndex id)

{
  size_type sVar1;
  const_reference this;
  pointer pDVar2;
  Fatal local_1a8;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *local_20;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *segments;
  BinaryenModuleRef pMStack_10;
  BinaryenIndex id_local;
  BinaryenModuleRef module_local;
  
  local_20 = &module->dataSegments;
  segments._4_4_ = id;
  pMStack_10 = module;
  sVar1 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::size(local_20);
  if (sVar1 <= segments._4_4_) {
    wasm::Fatal::Fatal(&local_1a8);
    wasm::Fatal::operator<<(&local_1a8,(char (*) [20])"invalid segment id.");
    wasm::Fatal::~Fatal(&local_1a8);
  }
  this = std::
         vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
         ::operator[](local_20,(ulong)segments._4_4_);
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (this);
  return (bool)(pDVar2->isPassive & 1);
}

Assistant:

bool BinaryenGetMemorySegmentPassive(BinaryenModuleRef module,
                                     BinaryenIndex id) {
  const auto& segments = ((Module*)module)->dataSegments;
  if (segments.size() <= id) {
    Fatal() << "invalid segment id.";
  }
  return segments[id]->isPassive;
}